

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateServiceDefinitions
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer this_01;
  int local_60;
  int i;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (local_60 = 0;
        sVar2 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                ::size(&this->service_generators_), (ulong)(long)local_60 < sVar2;
        local_60 = local_60 + 1) {
      if (0 < local_60) {
        Formatter::operator()<>((Formatter *)local_50,"\n");
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "// -------------------------------------------------------------------\n");
        Formatter::operator()<>((Formatter *)local_50,"\n");
      }
      this_00 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                ::operator[](&this->service_generators_,(long)local_60);
      this_01 = std::
                unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator->(this_00);
      ServiceGenerator::GenerateDeclarations
                (this_01,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    Formatter::operator()<>((Formatter *)local_50,"\n");
    Formatter::operator()<>
              ((Formatter *)local_50,
               "// ===================================================================\n");
    Formatter::operator()<>((Formatter *)local_50,"\n");
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateServiceDefinitions(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (HasGenericServices(file_, options_)) {
    // Generate service definitions.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i > 0) {
        format("\n");
        format(kThinSeparator);
        format("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    format("\n");
    format(kThickSeparator);
    format("\n");
  }
}